

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflickgesture.cpp
# Opt level: O3

Result __thiscall
QFlickGestureRecognizer::recognize
          (QFlickGestureRecognizer *this,QGesture *state,QObject *watched,QEvent *event)

{
  undefined8 *puVar1;
  ushort uVar2;
  QScroller *this_00;
  QScroller *this_01;
  QWidgetData *pQVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined8 uVar9;
  char cVar10;
  bool bVar11;
  QFlagsStorage<Qt::MouseButton> eventButtons;
  MouseButton MVar12;
  QFlagsStorage<Qt::MouseButton> QVar13;
  int iVar14;
  State SVar15;
  State SVar16;
  State SVar17;
  uint uVar18;
  long lVar19;
  PressDelayHandler *pPVar20;
  QEvent *pQVar21;
  QWidget *pQVar22;
  long lVar23;
  QGraphicsScene *this_02;
  long lVar24;
  qint64 timestamp;
  QPoint QVar25;
  QEvent *pQVar26;
  QGraphicsItem *this_03;
  uint uVar27;
  QFlagsStorage<QGestureRecognizer::ResultFlag> QVar28;
  QEvent *this_04;
  undefined8 *puVar29;
  long in_FS_OFFSET;
  bool bVar30;
  qreal extraout_XMM1_Qa;
  double extraout_XMM1_Qa_00;
  qreal extraout_XMM1_Qa_01;
  qreal extraout_XMM1_Qa_02;
  qreal extraout_XMM1_Qa_03;
  double extraout_XMM1_Qa_04;
  double extraout_XMM1_Qa_05;
  double extraout_XMM1_Qa_06;
  double extraout_XMM1_Qa_07;
  double extraout_XMM1_Qa_08;
  double extraout_XMM1_Qa_09;
  double dVar31;
  double dVar32;
  QPointF QVar33;
  QRegion scrollerRegion;
  Input local_1a0;
  QFlagsStorage<Qt::KeyboardModifier> local_194;
  QPoint local_f8;
  QPolygon local_f0;
  QPolygon local_d8;
  QRegion local_c0;
  QPolygonF local_b8;
  QPoint local_a0;
  QArrayData *local_98;
  undefined8 *puStack_90;
  QScrollerPrivate *local_88;
  QPointF local_78;
  QPoint local_60;
  undefined1 local_58 [12];
  Representation RStack_4c;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar10 = QElapsedTimer::isValid();
  if (cVar10 == '\0') {
    QElapsedTimer::start();
  }
  lVar24 = *(long *)&state->field_0x8;
  this_00 = *(QScroller **)(lVar24 + 0xb8);
  QVar28.i = 1;
  if (this_00 == (QScroller *)0x0) goto LAB_006506ce;
  if (*(long *)(lVar24 + 0xa8) == 0) {
    lVar23 = 0;
  }
  else if ((*(int *)(*(long *)(lVar24 + 0xa8) + 4) == 0) ||
          (lVar19 = *(long *)(lVar24 + 0xb0), lVar19 == 0)) {
    lVar23 = 0;
  }
  else {
    lVar23 = 0;
    if ((*(byte *)(*(long *)(lVar19 + 8) + 0x30) & 1) != 0) {
      lVar23 = lVar19;
    }
  }
  lVar19 = QMetaObject::cast((QObject *)&QGraphicsObject::staticMetaObject);
  pPVar20 = PressDelayHandler::instance();
  if (pPVar20->sendingEvent != false) goto LAB_006506ce;
  local_60.xp.m_i = 0;
  local_60.yp.m_i = 0;
  uVar2 = *(ushort *)(event + 8);
  if (uVar2 < 0x1f) {
    if (uVar2 - 2 < 2) {
LAB_006504b3:
      if ((lVar23 != 0) && (this->button != NoButton)) {
        local_194.i = *(Int *)(event + 0x20);
        eventButtons.i = *(Int *)(event + 0x44);
        dVar32 = (double)QEventPoint::globalPosition();
        dVar32 = (double)(((ulong)dVar32 >> 0x20 & 0x80000000) << 0x20 | (ulong)DAT_006605c0) +
                 dVar32;
        bVar11 = 2147483647.0 < dVar32;
        if (dVar32 <= -2147483648.0) {
          dVar32 = -2147483648.0;
        }
        local_60.xp.m_i =
             (int)(double)(-(ulong)bVar11 & 0x41dfffffffc00000 | ~-(ulong)bVar11 & (ulong)dVar32);
        dVar32 = (double)((ulong)extraout_XMM1_Qa_00 & 0x8000000000000000 | (ulong)DAT_006605c0) +
                 extraout_XMM1_Qa_00;
        bVar11 = 2147483647.0 < dVar32;
        if (dVar32 <= -2147483648.0) {
          dVar32 = -2147483648.0;
        }
        local_60.yp.m_i =
             (int)(double)(-(ulong)bVar11 & 0x41dfffffffc00000 | ~-(ulong)bVar11 & (ulong)dVar32);
        pQVar26 = (QEvent *)0x0;
        this_04 = (QEvent *)0x0;
        pQVar21 = event;
        goto LAB_006505bd;
      }
    }
    else if (uVar2 == 4) {
      SVar15 = QScroller::state(this_00);
LAB_006506c5:
      QVar28.i = 0x101;
      if (SVar15 != Inactive) goto LAB_006506ce;
    }
    else if (uVar2 == 5) goto LAB_006504b3;
  }
  else if (uVar2 - 0x9b < 3) {
    if ((lVar19 != 0) && (this->button != NoButton)) {
      local_194.i = (Int)QGraphicsSceneMouseEvent::modifiers((QGraphicsSceneMouseEvent *)event);
      eventButtons.i = (Int)QGraphicsSceneMouseEvent::buttons((QGraphicsSceneMouseEvent *)event);
      local_60 = QGraphicsSceneMouseEvent::screenPos((QGraphicsSceneMouseEvent *)event);
      pQVar26 = (QEvent *)0x0;
      this_04 = event;
LAB_006505bb:
      pQVar21 = (QEvent *)0x0;
LAB_006505bd:
      bVar11 = this_04 != (QEvent *)0x0 || pQVar21 != (QEvent *)0x0;
      local_78 = (QPointF)ZEXT816(0);
      uVar2 = *(ushort *)(event + 8);
      local_1a0 = 0;
      if (uVar2 < 0x9c) {
        if (uVar2 < 5) {
          if (uVar2 == 2) {
            if (pQVar21 != (QEvent *)0x0) {
              if ((*(MouseButton *)(pQVar21 + 0x40) != this->button) ||
                 (*(MouseButton *)(pQVar21 + 0x44) != *(MouseButton *)(pQVar21 + 0x40)))
              goto LAB_00650faa;
              local_58._0_8_ = QEventPoint::globalPosition();
              stack0xffffffffffffffb0 = extraout_XMM1_Qa_02;
              QVar25 = QPointF::toPoint((QPointF *)local_58);
              local_78.xp = (qreal)QVar25.xp.m_i.m_i;
              local_78.yp = (qreal)QVar25.yp.m_i.m_i;
              goto LAB_00650893;
            }
          }
          else if (((uVar2 == 3) && (pQVar21 != (QEvent *)0x0)) &&
                  (*(MouseButton *)(pQVar21 + 0x40) == this->button)) {
            local_58._0_8_ = QEventPoint::globalPosition();
            stack0xffffffffffffffb0 = extraout_XMM1_Qa_01;
            QVar25 = QPointF::toPoint((QPointF *)local_58);
            local_78.xp = (qreal)QVar25.xp.m_i.m_i;
            local_78.yp = (qreal)QVar25.yp.m_i.m_i;
            goto LAB_00650773;
          }
        }
        else if (uVar2 == 5) {
          if ((pQVar21 != (QEvent *)0x0) && (*(MouseButton *)(pQVar21 + 0x44) == this->button)) {
            local_58._0_8_ = QEventPoint::globalPosition();
            stack0xffffffffffffffb0 = extraout_XMM1_Qa_03;
            QVar25 = QPointF::toPoint((QPointF *)local_58);
            local_78.xp = (qreal)QVar25.xp.m_i.m_i;
            local_78.yp = (qreal)QVar25.yp.m_i.m_i;
            goto LAB_00650830;
          }
        }
        else if (((uVar2 == 0x9b) && (this_04 != (QEvent *)0x0)) &&
                (QVar13.i = (Int)QGraphicsSceneMouseEvent::buttons
                                           ((QGraphicsSceneMouseEvent *)this_04),
                QVar13.i == this->button)) {
          QVar33 = QGraphicsSceneMouseEvent::scenePos((QGraphicsSceneMouseEvent *)this_04);
          local_78.yp = QVar33.yp;
          local_78.xp = QVar33.xp;
LAB_00650830:
          local_1a0 = InputMove;
        }
      }
      else if (uVar2 < 0xc2) {
        if (uVar2 == 0x9c) {
          if (this_04 != (QEvent *)0x0) {
            MVar12 = QGraphicsSceneMouseEvent::button((QGraphicsSceneMouseEvent *)this_04);
            if ((MVar12 != this->button) ||
               (QVar13.i = (Int)QGraphicsSceneMouseEvent::buttons
                                          ((QGraphicsSceneMouseEvent *)this_04),
               QVar13.i != this->button)) {
LAB_00650faa:
              QScroller::stop(this_00);
              QVar28.i = 0x10;
              goto LAB_006506ce;
            }
            QVar33 = QGraphicsSceneMouseEvent::scenePos((QGraphicsSceneMouseEvent *)this_04);
            local_78.yp = QVar33.yp;
            local_78.xp = QVar33.xp;
LAB_00650893:
            goto LAB_006509da;
          }
        }
        else if (((uVar2 == 0x9d) && (this_04 != (QEvent *)0x0)) &&
                (MVar12 = QGraphicsSceneMouseEvent::button((QGraphicsSceneMouseEvent *)this_04),
                MVar12 == this->button)) {
          QVar33 = QGraphicsSceneMouseEvent::scenePos((QGraphicsSceneMouseEvent *)this_04);
          local_78.yp = QVar33.yp;
          local_78.xp = QVar33.xp;
LAB_00650773:
          local_1a0 = InputRelease;
        }
      }
      else {
        if (uVar2 == 0xc2) {
          local_1a0 = InputPress;
          bVar30 = true;
        }
        else {
          if (uVar2 == 0xc3) {
            local_1a0 = InputMove;
          }
          else {
            if (uVar2 != 0xc4) goto LAB_00650d7c;
            local_1a0 = InputRelease;
          }
          bVar30 = false;
        }
        QPointerEvent::pointingDevice();
        iVar14 = QInputDevice::type();
        QVar28.i = 1;
        if (iVar14 == 4) {
          if (*(long *)(pQVar26 + 0x38) != 2) goto LAB_006506ce;
          dVar32 = (double)QEventPoint::scenePressPosition();
          dVar7 = (double)QEventPoint::scenePosition();
          dVar6 = (double)QEventPoint::scenePressPosition();
          dVar5 = (double)QEventPoint::scenePosition();
          dVar31 = (double)QEventPoint::scenePressPosition();
          dVar32 = dVar32 + ((dVar5 - dVar31) + (dVar7 - dVar6)) * 0.5;
          dVar31 = extraout_XMM1_Qa_04 +
                   ((extraout_XMM1_Qa_07 - extraout_XMM1_Qa_08) +
                   (extraout_XMM1_Qa_05 - extraout_XMM1_Qa_06)) * 0.5;
        }
        else {
          if (*(long *)(pQVar26 + 0x38) != 1) goto LAB_006506ce;
          dVar32 = (double)QEventPoint::scenePosition();
          dVar31 = extraout_XMM1_Qa_09;
        }
        local_78.yp._0_4_ = SUB84(dVar31,0);
        local_78.xp = dVar32;
        local_78.yp._4_4_ = (int)((ulong)dVar31 >> 0x20);
        if (bVar30) {
LAB_006509da:
          local_88 = (QScrollerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
          local_98 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
          puStack_90 = (undefined8 *)&DAT_aaaaaaaaaaaaaaaa;
          QScroller::activeScrollers();
          if (local_88 != (QScrollerPrivate *)0x0) {
            puVar1 = puStack_90 + (long)local_88;
            puVar29 = puStack_90;
            do {
              this_01 = (QScroller *)*puVar29;
              if (this_01 != this_00) {
                local_a0 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
                QRegion::QRegion((QRegion *)&local_a0);
                pQVar22 = (QWidget *)QScroller::target(this_01);
                if ((pQVar22 == (QWidget *)0x0) ||
                   ((*(byte *)(*(long *)&pQVar22->field_0x8 + 0x30) & 1) == 0)) {
                  QScroller::target(this_01);
                  lVar23 = QMetaObject::cast((QObject *)&QGraphicsObject::staticMetaObject);
                  if (lVar23 != 0) {
                    this_03 = (QGraphicsItem *)(lVar23 + 0x10);
                    this_02 = (QGraphicsScene *)QGraphicsItem::scene(this_03);
                    if (this_02 != (QGraphicsScene *)0x0) {
                      local_b8.super_QList<QPointF>.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                      local_b8.super_QList<QPointF>.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                      local_b8.super_QList<QPointF>.d.ptr._0_4_ = 0xaaaaaaaa;
                      local_b8.super_QList<QPointF>.d.ptr._4_4_ = 0xaaaaaaaa;
                      (*this_03->_vptr_QGraphicsItem[3])((QRectF *)local_58,this_03);
                      QGraphicsItem::mapToScene(&local_b8,this_03,(QRectF *)local_58);
                      local_48 = &DAT_aaaaaaaaaaaaaaaa;
                      stack0xffffffffffffffb0 = &DAT_aaaaaaaaaaaaaaaa;
                      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                      QGraphicsScene::views((QList<QGraphicsView_*> *)local_58,this_02);
                      if ((undefined1 *)local_48 != (undefined1 *)0x0) {
                        uVar9 = stack0xffffffffffffffb0;
                        lVar23 = local_48 << 3;
                        lVar19 = 0;
                        do {
                          pQVar22 = *(QWidget **)(uVar9 + lVar19);
                          QGraphicsView::mapFromScene(&local_f0,(QGraphicsView *)pQVar22,&local_b8);
                          local_f8.xp.m_i = 0;
                          local_f8.yp.m_i = 0;
                          QWidget::mapToGlobal(pQVar22,&local_f8);
                          QPolygon::translated((int)&local_d8,(int)&local_f0);
                          QRegion::QRegion(&local_c0,&local_d8,OddEvenFill);
                          QRegion::operator|=((QRegion *)&local_a0,&local_c0);
                          QRegion::~QRegion(&local_c0);
                          if ((QPoint)local_d8.super_QList<QPoint>.d.d != (QPoint)0x0) {
                            LOCK();
                            *(int *)local_d8.super_QList<QPoint>.d.d =
                                 *(int *)local_d8.super_QList<QPoint>.d.d + -1;
                            UNLOCK();
                            if (*(int *)local_d8.super_QList<QPoint>.d.d == 0) {
                              QArrayData::deallocate
                                        (&(local_d8.super_QList<QPoint>.d.d)->super_QArrayData,8,
                                         0x10);
                            }
                          }
                          if (&(local_f0.super_QList<QPoint>.d.d)->super_QArrayData !=
                              (QArrayData *)0x0) {
                            LOCK();
                            ((local_f0.super_QList<QPoint>.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i =
                                 ((local_f0.super_QList<QPoint>.d.d)->super_QArrayData).ref_.
                                 _q_value.super___atomic_base<int>._M_i + -1;
                            UNLOCK();
                            if (((local_f0.super_QList<QPoint>.d.d)->super_QArrayData).ref_._q_value
                                .super___atomic_base<int>._M_i == 0) {
                              QArrayData::deallocate
                                        (&(local_f0.super_QList<QPoint>.d.d)->super_QArrayData,8,
                                         0x10);
                            }
                          }
                          lVar19 = lVar19 + 8;
                        } while (lVar23 != lVar19);
                      }
                      if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
                        LOCK();
                        *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
                        UNLOCK();
                        if (*(int *)local_58._0_8_ == 0) {
                          QArrayData::deallocate((QArrayData *)local_58._0_8_,8,0x10);
                        }
                      }
                      if ((QPoint)local_b8.super_QList<QPointF>.d.d != (QPoint)0x0) {
                        LOCK();
                        *(int *)local_b8.super_QList<QPointF>.d.d =
                             *(int *)local_b8.super_QList<QPointF>.d.d + -1;
                        UNLOCK();
                        if (*(int *)local_b8.super_QList<QPointF>.d.d == 0) {
                          QArrayData::deallocate
                                    (&(local_b8.super_QList<QPointF>.d.d)->super_QArrayData,0x10,
                                     0x10);
                        }
                      }
                    }
                  }
                }
                else {
                  local_d8.super_QList<QPoint>.d.d = (Data *)0x0;
                  local_58._0_8_ = QWidget::mapToGlobal(pQVar22,(QPoint *)&local_d8);
                  pQVar3 = pQVar22->data;
                  local_58._8_4_ =
                       ((pQVar3->crect).x2.m_i + (int)local_58._0_8_) - (pQVar3->crect).x1.m_i;
                  RStack_4c.m_i =
                       ((pQVar3->crect).y2.m_i + SUB84(local_58._0_8_,4)) - (pQVar3->crect).y1.m_i;
                  QRegion::QRegion((QRegion *)&local_b8,(QRect *)local_58,Rectangle);
                  QVar25 = local_a0;
                  local_a0 = (QPoint)local_b8.super_QList<QPointF>.d.d;
                  local_b8.super_QList<QPointF>.d.d = (Data *)QVar25;
                  QRegion::~QRegion((QRegion *)&local_b8);
                }
                cVar10 = QRegion::contains(&local_a0);
                QRegion::~QRegion((QRegion *)&local_a0);
                if (cVar10 != '\0') {
                  if (local_98 != (QArrayData *)0x0) {
                    LOCK();
                    (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
                         (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(local_98,8,0x10);
                    }
                  }
                  goto LAB_006506c9;
                }
              }
              puVar29 = puVar29 + 1;
            } while (puVar29 != puVar1);
          }
          if (local_98 != (QArrayData *)0x0) {
            LOCK();
            (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_98,8,0x10);
            }
          }
          local_1a0 = InputPress;
        }
      }
LAB_00650d7c:
      SVar15 = QScroller::state(this_00);
      SVar16 = QScroller::state(this_00);
      auVar8 = _local_58;
      if (local_1a0 != 0) {
        if (((*(long *)(lVar24 + 0xa8) == 0) || (*(int *)(*(long *)(lVar24 + 0xa8) + 4) == 0)) ||
           ((pQVar22 = *(QWidget **)(lVar24 + 0xb0), pQVar22 == (QWidget *)0x0 ||
            ((*(byte *)(*(long *)&pQVar22->field_0x8 + 0x30) & 1) == 0)))) {
          lVar24 = QMetaObject::cast((QObject *)&QGraphicsObject::staticMetaObject);
          if (lVar24 != 0) {
            local_78 = QGraphicsItem::mapFromScene((QGraphicsItem *)(lVar24 + 0x10),&local_78);
          }
        }
        else {
          dVar32 = (double)((ulong)local_78.xp & 0x8000000000000000 | 0x3fe0000000000000) +
                   local_78.xp;
          bVar30 = 2147483647.0 < dVar32;
          if (dVar32 <= -2147483648.0) {
            dVar32 = -2147483648.0;
          }
          dVar31 = (double)((ulong)local_78.yp & 0x8000000000000000 | 0x3fe0000000000000) +
                   local_78.yp;
          bVar4 = 2147483647.0 < dVar31;
          if (dVar31 <= -2147483648.0) {
            dVar31 = -2147483648.0;
          }
          local_58._4_4_ =
               (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar31);
          local_58._0_4_ =
               (int)(double)(-(ulong)bVar30 & 0x41dfffffffc00000 | ~-(ulong)bVar30 & (ulong)dVar32);
          stack0xffffffffffffffb0 = auVar8._8_8_;
          QVar25 = QWidget::mapFromGlobal(pQVar22,(QPoint *)local_58);
          local_78.yp = (double)QVar25.yp.m_i.m_i;
          local_78.xp = (double)QVar25.xp.m_i.m_i;
        }
        timestamp = QElapsedTimer::elapsed();
        QScroller::handleInput(this_00,local_1a0,&local_78,timestamp);
      }
      SVar17 = QScroller::state(this_00);
      bVar30 = true;
      if (SVar17 != Dragging) {
        SVar17 = QScroller::state(this_00);
        bVar30 = SVar17 == Scrolling;
      }
      if (bVar11) {
        if (((SVar15 == Dragging) || (SVar16 == Scrolling)) || (bVar30 != true)) {
          if ((SVar16 == Scrolling) &&
             ((SVar17 = QScroller::state(this_00), SVar17 == Dragging ||
              (SVar17 = QScroller::state(this_00), SVar17 == Inactive)))) {
            pPVar20 = PressDelayHandler::instance();
            PressDelayHandler::scrollerWasIntercepted(pPVar20);
          }
        }
        else {
          pPVar20 = PressDelayHandler::instance();
          PressDelayHandler::scrollerBecameActive
                    (pPVar20,(KeyboardModifiers)local_194.i,(MouseButtons)eventButtons.i);
        }
      }
      uVar18 = (uint)(byte)(bVar11 & bVar30) << 8;
      if (local_1a0 != 0) {
        uVar2 = *(ushort *)(event + 8);
        uVar27 = uVar18;
        if (uVar2 < 0x9c) {
          if (uVar2 < 5) {
            if (uVar2 == 2) goto LAB_00650fbc;
            if (uVar2 == 3) goto LAB_00650f52;
          }
          else if ((uVar2 == 5) || (uVar2 == 0x9b)) {
            pPVar20 = PressDelayHandler::instance();
            uVar27 = 0x100;
            if ((pPVar20->pressDelayEvent).d == (QMouseEvent *)0x0) {
              uVar27 = uVar18;
            }
LAB_00650f39:
            uVar18 = (uint)bVar30 + (uint)bVar30 * 2 + 1;
LAB_00650f99:
            QVar28.i = uVar18 | uVar27;
            goto LAB_006506ce;
          }
        }
        else if (uVar2 < 0xc2) {
          if (uVar2 == 0x9c) {
LAB_00650fbc:
            SVar15 = QScroller::state(this_00);
            if (SVar15 == Pressed) {
              QScroller::scrollerProperties((QScroller *)&local_98);
              QScrollerProperties::scrollMetric
                        ((QVariant *)local_58,(QScrollerProperties *)&local_98,MousePressEventDelay)
              ;
              dVar32 = (double)::QVariant::toReal((bool *)local_58);
              ::QVariant::~QVariant((QVariant *)local_58);
              QScrollerProperties::~QScrollerProperties((QScrollerProperties *)&local_98);
              if (0 < (int)(dVar32 * 1000.0)) {
                pPVar20 = PressDelayHandler::instance();
                PressDelayHandler::pressed(pPVar20,event,(int)(dVar32 * 1000.0));
                event[0xc] = (QEvent)0x1;
                uVar18 = 0x100;
              }
            }
            goto LAB_0065103f;
          }
          if (uVar2 == 0x9d) {
LAB_00650f52:
            pPVar20 = PressDelayHandler::instance();
            bVar11 = PressDelayHandler::released
                               (pPVar20,event,SVar15 == Dragging || SVar16 == Scrolling,bVar30);
            if (bVar11) {
              uVar27 = 0x100;
            }
LAB_00650f8a:
            uVar18 = (uint)(bVar30 ^ 1) * 8 + 8;
            goto LAB_00650f99;
          }
        }
        else {
          if (uVar2 == 0xc2) {
LAB_0065103f:
            local_58._8_4_ = SUB84((double)local_60.yp.m_i.m_i,0);
            local_58._0_8_ = (double)local_60.xp.m_i.m_i;
            RStack_4c.m_i = (int)((ulong)(double)local_60.yp.m_i.m_i >> 0x20);
            QGesture::setHotSpot(state,(QPointF *)local_58);
            QVar28.i = uVar18 + 2 + (uint)bVar30 * 2;
            goto LAB_006506ce;
          }
          if (uVar2 == 0xc3) goto LAB_00650f39;
          if (uVar2 == 0xc4) goto LAB_00650f8a;
        }
      }
      QVar28.i = uVar18 | 1;
      goto LAB_006506ce;
    }
  }
  else if (uVar2 - 0xc2 < 3) {
    if (this->button == NoButton) {
      local_194.i = *(Int *)(event + 0x20);
      if (*(long *)(event + 0x38) != 0) {
        local_58._0_8_ = QEventPoint::globalPosition();
        stack0xffffffffffffffb0 = extraout_XMM1_Qa;
        local_60 = QPointF::toPoint((QPointF *)local_58);
      }
      eventButtons.i = 0;
      pQVar26 = event;
      this_04 = (QEvent *)0x0;
      goto LAB_006505bb;
    }
  }
  else if (uVar2 == 0x1f) {
    QVar28.i = 0x101;
    if (*(char *)(lVar24 + 0xc4) != '\0') goto LAB_006506ce;
    SVar15 = QScroller::state(this_00);
    goto LAB_006506c5;
  }
LAB_006506c9:
  QVar28.i = 1;
LAB_006506ce:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QFlagsStorageHelper<QGestureRecognizer::ResultFlag,_4>)
           (QFlagsStorageHelper<QGestureRecognizer::ResultFlag,_4>)QVar28.i;
  }
  __stack_chk_fail();
}

Assistant:

QGestureRecognizer::Result QFlickGestureRecognizer::recognize(QGesture *state,
                                                              QObject *watched,
                                                              QEvent *event)
{
    Q_UNUSED(watched);

    Q_CONSTINIT static QElapsedTimer monotonicTimer;
    if (!monotonicTimer.isValid())
        monotonicTimer.start();

    QFlickGesture *q = static_cast<QFlickGesture *>(state);
    QFlickGesturePrivate *d = q->d_func();

    QScroller *scroller = d->receiverScroller;
    if (!scroller)
        return Ignore; // nothing to do without a scroller?

    QWidget *receiverWidget = qobject_cast<QWidget *>(d->receiver);
#if QT_CONFIG(graphicsview)
    QGraphicsObject *receiverGraphicsObject = qobject_cast<QGraphicsObject *>(d->receiver);
#endif

    // this is only set for events that we inject into the event loop via sendEvent()
    if (PressDelayHandler::instance()->shouldEventBeIgnored(event)) {
        //qFGDebug() << state << "QFG: ignored event: " << event->type();
        return Ignore;
    }

    const QMouseEvent *me = nullptr;
#if QT_CONFIG(graphicsview)
    const QGraphicsSceneMouseEvent *gsme = nullptr;
#endif
    const QTouchEvent *te = nullptr;
    QPoint globalPos;

    // qFGDebug() << "FlickGesture "<<state<<"watched:"<<watched<<"receiver"<<d->receiver<<"event"<<event->type()<<"button"<<button;

    Qt::KeyboardModifiers keyboardModifiers = Qt::NoModifier;
    Qt::MouseButtons mouseButtons = Qt::NoButton;
    switch (event->type()) {
    case QEvent::MouseButtonPress:
    case QEvent::MouseButtonRelease:
    case QEvent::MouseMove:
        if (!receiverWidget)
            return Ignore;
        if (button != Qt::NoButton) {
            me = static_cast<const QMouseEvent *>(event);
            keyboardModifiers = me->modifiers();
            mouseButtons = me->buttons();
            globalPos = me->globalPosition().toPoint();
        }
        break;
#if QT_CONFIG(graphicsview)
    case QEvent::GraphicsSceneMousePress:
    case QEvent::GraphicsSceneMouseRelease:
    case QEvent::GraphicsSceneMouseMove:
        if (!receiverGraphicsObject)
            return Ignore;
        if (button != Qt::NoButton) {
            gsme = static_cast<const QGraphicsSceneMouseEvent *>(event);
            keyboardModifiers = gsme->modifiers();
            mouseButtons = gsme->buttons();
            globalPos = gsme->screenPos();
        }
        break;
#endif
    case QEvent::TouchBegin:
    case QEvent::TouchEnd:
    case QEvent::TouchUpdate:
        if (button == Qt::NoButton) {
            te = static_cast<const QTouchEvent *>(event);
            keyboardModifiers = te->modifiers();
            if (!te->points().isEmpty())
                globalPos = te->points().at(0).globalPosition().toPoint();
        }
        break;

    // consume all wheel events if the scroller is active
    case QEvent::Wheel:
        if (d->macIgnoreWheel || (scroller->state() != QScroller::Inactive))
            return Ignore | ConsumeEventHint;
        break;

    // consume all dbl click events if the scroller is active
    case QEvent::MouseButtonDblClick:
        if (scroller->state() != QScroller::Inactive)
            return Ignore | ConsumeEventHint;
        break;

    default:
        break;
    }

    if (!me
#if QT_CONFIG(graphicsview)
        && !gsme
#endif
        && !te) // Neither mouse nor touch
        return Ignore;

    // get the current pointer position in local coordinates.
    QPointF point;
    QScroller::Input inputType = (QScroller::Input) 0;

    switch (event->type()) {
    case QEvent::MouseButtonPress:
        if (me && me->button() == button && me->buttons() == button) {
            point = me->globalPosition().toPoint();
            inputType = QScroller::InputPress;
        } else if (me) {
            scroller->stop();
            return CancelGesture;
        }
        break;
    case QEvent::MouseButtonRelease:
        if (me && me->button() == button) {
            point = me->globalPosition().toPoint();
            inputType = QScroller::InputRelease;
        }
        break;
    case QEvent::MouseMove:
        if (me && me->buttons() == button) {
            point = me->globalPosition().toPoint();
            inputType = QScroller::InputMove;
        }
        break;

#if QT_CONFIG(graphicsview)
    case QEvent::GraphicsSceneMousePress:
        if (gsme && gsme->button() == button && gsme->buttons() == button) {
            point = gsme->scenePos();
            inputType = QScroller::InputPress;
        } else if (gsme) {
            scroller->stop();
            return CancelGesture;
        }
        break;
    case QEvent::GraphicsSceneMouseRelease:
        if (gsme && gsme->button() == button) {
            point = gsme->scenePos();
            inputType = QScroller::InputRelease;
        }
        break;
    case QEvent::GraphicsSceneMouseMove:
        if (gsme && gsme->buttons() == button) {
            point = gsme->scenePos();
            inputType = QScroller::InputMove;
        }
        break;
#endif

    case QEvent::TouchBegin:
        inputType = QScroller::InputPress;
        Q_FALLTHROUGH();
    case QEvent::TouchEnd:
        if (!inputType)
            inputType = QScroller::InputRelease;
        Q_FALLTHROUGH();
    case QEvent::TouchUpdate:
        if (!inputType)
            inputType = QScroller::InputMove;

        if (te->pointingDevice()->type() == QInputDevice::DeviceType::TouchPad) {
            if (te->points().size() != 2)  // 2 fingers on pad
                return Ignore;

            point = te->points().at(0).scenePressPosition() +
                    ((te->points().at(0).scenePosition() - te->points().at(0).scenePressPosition()) +
                     (te->points().at(1).scenePosition() - te->points().at(1).scenePressPosition())) / 2;
        } else { // TouchScreen
            if (te->points().size() != 1) // 1 finger on screen
                return Ignore;

            point = te->points().at(0).scenePosition();
        }
        break;

    default:
        break;
    }

    // Check for an active scroller at globalPos
    if (inputType == QScroller::InputPress) {
        const auto activeScrollers = QScroller::activeScrollers();
        for (QScroller *as : activeScrollers) {
            if (as != scroller) {
                QRegion scrollerRegion;

                if (QWidget *w = qobject_cast<QWidget *>(as->target())) {
                    scrollerRegion = QRect(w->mapToGlobal(QPoint(0, 0)), w->size());
#if QT_CONFIG(graphicsview)
                } else if (QGraphicsObject *go = qobject_cast<QGraphicsObject *>(as->target())) {
                    if (const auto *scene = go->scene()) {
                        const auto goBoundingRectMappedToScene = go->mapToScene(go->boundingRect());
                        const auto views = scene->views();
                        for (QGraphicsView *gv : views) {
                            scrollerRegion |= gv->mapFromScene(goBoundingRectMappedToScene)
                                              .translated(gv->mapToGlobal(QPoint(0, 0)));
                        }
                    }
#endif
                }
                // active scrollers always have priority
                if (scrollerRegion.contains(globalPos))
                    return Ignore;
            }
        }
    }

    bool scrollerWasDragging = (scroller->state() == QScroller::Dragging);
    bool scrollerWasScrolling = (scroller->state() == QScroller::Scrolling);

    if (inputType) {
        if (QWidget *w = qobject_cast<QWidget *>(d->receiver))
            point = w->mapFromGlobal(point.toPoint());
#if QT_CONFIG(graphicsview)
        else if (QGraphicsObject *go = qobject_cast<QGraphicsObject *>(d->receiver))
            point = go->mapFromScene(point);
#endif

        // inform the scroller about the new event
        scroller->handleInput(inputType, point, monotonicTimer.elapsed());
    }

    // depending on the scroller state return the gesture state
    Result result;
    bool scrollerIsActive = (scroller->state() == QScroller::Dragging ||
                             scroller->state() == QScroller::Scrolling);

    // Consume all mouse events while dragging or scrolling to avoid nasty
    // side effects with Qt's standard widgets.
    if ((me
#if QT_CONFIG(graphicsview)
         || gsme
#endif
         ) && scrollerIsActive)
        result |= ConsumeEventHint;

    // The only problem with this approach is that we consume the
    // MouseRelease when we start the scrolling with a flick gesture, so we
    // have to fake a MouseRelease "somewhere" to not mess with the internal
    // states of Qt's widgets (a QPushButton would stay in 'pressed' state
    // forever, if it doesn't receive a MouseRelease).
    if (me
#if QT_CONFIG(graphicsview)
        || gsme
#endif
        ) {
        if (!scrollerWasDragging && !scrollerWasScrolling && scrollerIsActive)
            PressDelayHandler::instance()->scrollerBecameActive(keyboardModifiers, mouseButtons);
        else if (scrollerWasScrolling && (scroller->state() == QScroller::Dragging || scroller->state() == QScroller::Inactive))
            PressDelayHandler::instance()->scrollerWasIntercepted();
    }

    if (!inputType) {
        result |= Ignore;
    } else {
        switch (event->type()) {
        case QEvent::MouseButtonPress:
#if QT_CONFIG(graphicsview)
        case QEvent::GraphicsSceneMousePress:
#endif
            if (scroller->state() == QScroller::Pressed) {
                int pressDelay = int(1000 * scroller->scrollerProperties().scrollMetric(QScrollerProperties::MousePressEventDelay).toReal());
                if (pressDelay > 0) {
                    result |= ConsumeEventHint;

                    PressDelayHandler::instance()->pressed(event, pressDelay);
                    event->accept();
                }
            }
            Q_FALLTHROUGH();
        case QEvent::TouchBegin:
            q->setHotSpot(globalPos);
            result |= scrollerIsActive ? TriggerGesture : MayBeGesture;
            break;

        case QEvent::MouseMove:
#if QT_CONFIG(graphicsview)
        case QEvent::GraphicsSceneMouseMove:
#endif
            if (PressDelayHandler::instance()->isDelaying())
                result |= ConsumeEventHint;
            Q_FALLTHROUGH();
        case QEvent::TouchUpdate:
            result |= scrollerIsActive ? TriggerGesture : Ignore;
            break;

#if QT_CONFIG(graphicsview)
        case QEvent::GraphicsSceneMouseRelease:
#endif
        case QEvent::MouseButtonRelease:
            if (PressDelayHandler::instance()->released(event, scrollerWasDragging || scrollerWasScrolling, scrollerIsActive))
                result |= ConsumeEventHint;
            Q_FALLTHROUGH();
        case QEvent::TouchEnd:
            result |= scrollerIsActive ? FinishGesture : CancelGesture;
            break;

        default:
            result |= Ignore;
            break;
        }
    }
    return result;
}